

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O3

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::add(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
      *this,Node *node,size_t depth,Box<float> *box,Node **value)

{
  float *pfVar1;
  unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  uVar2;
  default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
  *this_00;
  _Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
  *p_Var3;
  _Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
  _Var4;
  Node *pNVar5;
  uint uVar6;
  undefined8 *puVar7;
  Node **ppNVar8;
  vector<Node*,std::allocator<Node*>> *this_01;
  Box<float> *extraout_RDX;
  Box<float> *extraout_RDX_00;
  Box<float> *extraout_RDX_01;
  Box<float> *extraout_RDX_02;
  Box<float> *pBVar9;
  long lVar10;
  iterator iVar11;
  Node **value_1;
  _Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
  *__args;
  Box<float> local_68;
  Box<float> *local_58;
  Node *local_50;
  undefined1 local_48 [8];
  Node *pNStack_40;
  Node *local_38;
  
  lVar10._0_4_ = (this->mBox).left;
  lVar10._4_4_ = (this->mBox).top;
  if (lVar10 == 0) {
    if (node < (Node *)0x8) {
      iVar11._M_current = *(Node ***)&this[1].mBox.width;
      if (0x7f < (ulong)((long)iVar11._M_current - *(long *)&this[1].mBox)) {
        lVar10 = 0;
        do {
          puVar7 = (undefined8 *)operator_new(0x38);
          *puVar7 = 0;
          puVar7[1] = 0;
          puVar7[2] = 0;
          puVar7[3] = 0;
          puVar7[4] = 0;
          puVar7[5] = 0;
          puVar7[6] = 0;
          this_00 = *(default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
                      **)((long)&(this->mBox).left + lVar10);
          *(undefined8 **)((long)&(this->mBox).left + lVar10) = puVar7;
          pBVar9 = extraout_RDX;
          if (this_00 !=
              (default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
               *)0x0) {
            std::
            default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
            ::operator()(this_00,(Node *)iVar11._M_current);
            pBVar9 = extraout_RDX_00;
          }
          lVar10 = lVar10 + 8;
        } while (lVar10 != 0x20);
        local_48._0_4_ = 0.0;
        local_48._4_4_ = 0.0;
        pNStack_40 = (Node *)0x0;
        local_38 = (Node *)0x0;
        __args = *(_Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                   **)&this[1].mBox;
        p_Var3 = *(_Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                   **)&this[1].mBox.width;
        local_58 = box;
        local_50 = node;
        if (__args == p_Var3) {
          local_38 = (Node *)0x0;
          pNStack_40 = (Node *)0x0;
          local_48._0_4_ = 0.0;
          local_48._4_4_ = 0.0;
        }
        else {
          do {
            _Var4._M_head_impl = __args->_M_head_impl;
            local_68._0_8_ = ((_Var4._M_head_impl)->children)._M_elems[0];
            local_68._8_8_ = *(undefined8 *)((long)&(_Var4._M_head_impl)->children + 8);
            uVar6 = getQuadrant((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                                 *)depth,&local_68,pBVar9);
            if (uVar6 == 0xffffffff) {
              this_01 = (vector<Node*,std::allocator<Node*>> *)local_48;
              ppNVar8 = &pNStack_40;
              iVar11._M_current = (Node **)pNStack_40;
              if (pNStack_40 != local_38) goto LAB_00101f97;
LAB_00101fa7:
              std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                        (this_01,iVar11,(Node **)__args);
              pBVar9 = extraout_RDX_02;
            }
            else {
              lVar10 = *(long *)(&(this->mBox).left + (ulong)uVar6 * 2);
              iVar11._M_current = *(Node ***)(lVar10 + 0x28);
              if ((Node *)iVar11._M_current == *(Node **)(lVar10 + 0x30)) {
                this_01 = (vector<Node*,std::allocator<Node*>> *)(lVar10 + 0x20);
                goto LAB_00101fa7;
              }
              ppNVar8 = (Node **)(lVar10 + 0x28);
LAB_00101f97:
              (((Node *)iVar11._M_current)->children)._M_elems[0]._M_t.
              super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
              ._M_t.
              super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
              .
              super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                   = (_Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                      )_Var4._M_head_impl;
              *ppNVar8 = (Node *)(((*ppNVar8)->children)._M_elems + 1);
              pBVar9 = extraout_RDX_01;
            }
            __args = __args + 1;
          } while (__args != p_Var3);
          __args = *(_Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                     **)&this[1].mBox;
        }
        pBVar9 = local_58;
        pNVar5 = this[1].mRoot._M_t.
                 super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                 .
                 super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                 ._M_head_impl;
        this[1].mBox.left = local_48._0_4_;
        this[1].mBox.top = local_48._4_4_;
        *(Node **)&this[1].mBox.width = pNStack_40;
        this[1].mRoot._M_t.
        super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
        ._M_t.
        super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
        .
        super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
        ._M_head_impl = local_38;
        local_48 = (undefined1  [8])0x0;
        pNStack_40 = (Node *)0x0;
        local_38 = (Node *)0x0;
        if ((__args != (_Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                        *)0x0) &&
           (operator_delete(__args,(long)pNVar5 - (long)__args), local_48 != (undefined1  [8])0x0))
        {
          operator_delete((void *)local_48,(long)local_38 - (long)local_48);
        }
        add(this,local_50,depth,pBVar9,value);
        return;
      }
    }
    else {
      iVar11._M_current = *(Node ***)&this[1].mBox.width;
    }
    if ((Node *)iVar11._M_current ==
        this[1].mRoot._M_t.
        super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
        ._M_t.
        super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
        .
        super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
        ._M_head_impl) goto LAB_00101e84;
    (((Node *)iVar11._M_current)->children)._M_elems[0]._M_t =
         (__uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
          )*(__uniq_ptr_data<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>,_true,_true>
             *)box;
  }
  else {
    uVar2._M_t.
    super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
    ._M_t.
    super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
    .
    super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
    ._M_head_impl =
         *(__uniq_ptr_data<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>,_true,_true>
           *)box;
    local_48 = *(undefined1 (*) [8])
                uVar2._M_t.
                super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                ._M_t.
                super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                .
                super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                ._M_head_impl;
    pNStack_40 = *(Node **)((long)uVar2._M_t.
                                  super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                                  .
                                  super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
                                  ._M_head_impl + 8);
    uVar6 = getQuadrant((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                         *)depth,(Box<float> *)local_48,(Box<float> *)depth);
    if (uVar6 != 0xffffffff) {
      (*(code *)(&DAT_00104048 + *(int *)(&DAT_00104048 + (ulong)uVar6 * 4)))
                (*(undefined4 *)depth,CONCAT44(*(float *)(depth + 0xc),*(float *)(depth + 8) * 0.5),
                 *(float *)(depth + 0xc) * 0.5,
                 *(undefined8 *)(&(this->mBox).left + (ulong)uVar6 * 2));
      return;
    }
    iVar11._M_current = *(Node ***)&this[1].mBox.width;
    if ((Node *)iVar11._M_current ==
        this[1].mRoot._M_t.
        super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
        ._M_t.
        super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
        .
        super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
        ._M_head_impl) {
LAB_00101e84:
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)(this + 1),iVar11,(Node **)box);
      return;
    }
    (((Node *)iVar11._M_current)->children)._M_elems[0]._M_t =
         uVar2._M_t.
         super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
         ._M_t.
         super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
         .
         super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
         ._M_head_impl;
  }
  pfVar1 = &this[1].mBox.width;
  *(long *)pfVar1 = *(long *)pfVar1 + 8;
  return;
}

Assistant:

void add(Node* node, std::size_t depth, const Box<Float>& box, const T& value)
    {
        assert(node != nullptr);
        assert(box.contains(mGetBox(value)));
        if (isLeaf(node))
        {
            // Insert the value in this node if possible
            if (depth >= MaxDepth || node->values.size() < Threshold)
                node->values.push_back(value);
            // Otherwise, we split and we try again
            else
            {
                split(node, box);
                add(node, depth, box, value);
            }
        }
        else
        {
            auto i = getQuadrant(box, mGetBox(value));
            // Add the value in a child if the value is entirely contained in it
            if (i != -1)
                add(node->children[static_cast<std::size_t>(i)].get(), depth + 1, computeBox(box, i), value);
            // Otherwise, we add the value in the current node
            else
                node->values.push_back(value);
        }
    }